

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

uint64_t __thiscall pstore::file::file_handle::tell(file_handle *this)

{
  int err;
  uint64_t uVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  ensure_open(this);
  uVar1 = lseek(this->file_,0,1);
  if (uVar1 == 0xffffffffffffffff) {
    piVar2 = __errno_location();
    err = *piVar2;
    std::__cxx11::string::string((string *)&bStack_38,(string *)&this->path_);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (err,"lseek/SEEK_CUR failed",&bStack_38);
  }
  if (-1 < (long)uVar1) {
    return uVar1;
  }
  assert_failed("r >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file_posix.cpp"
                ,0x11f);
}

Assistant:

std::uint64_t file_handle::tell () {
            this->ensure_open ();

            off_t const r = ::lseek (file_, off_t{0}, SEEK_CUR);
            if (r == off_t{-1}) {
                int const err = errno;
                raise_file_error (err, "lseek/SEEK_CUR failed", this->path ());
            }
            PSTORE_ASSERT (r >= 0);
            return static_cast<std::uint64_t> (r);
        }